

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_rank_function.cpp
# Opt level: O3

void __thiscall
duckdb::WindowCumeDistExecutor::EvaluateInternal
          (WindowCumeDistExecutor *this,WindowExecutorGlobalState *gstate,
          WindowExecutorLocalState *lstate,DataChunk *eval_chunk,Vector *result,idx_t count,
          idx_t row_idx)

{
  data_ptr_t pdVar1;
  data_ptr_t pdVar2;
  data_ptr_t pdVar3;
  data_ptr_t pdVar4;
  ulong uVar5;
  reference pvVar6;
  pointer this_00;
  idx_t iVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  idx_t iVar11;
  WindowExecutorLocalState *this_01;
  long lVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  double dVar16;
  
  pdVar1 = result->data;
  this_01 = lstate + 2;
  if (*(char *)&gstate[1].super_WindowExecutorState._vptr_WindowExecutorState == '\x01') {
    pvVar6 = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)this_01,6);
    pdVar2 = pvVar6->data;
    pvVar6 = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)this_01,7);
    pdVar3 = pvVar6->data;
    if (gstate[1].executor == (WindowExecutor *)0x0) {
      pvVar6 = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)this_01,3);
      if (count != 0) {
        pdVar4 = pvVar6->data;
        iVar11 = 0;
        do {
          uVar5 = *(ulong *)(pdVar3 + iVar11 * 8);
          uVar10 = *(ulong *)(pdVar4 + iVar11 * 8);
          if (uVar5 <= *(ulong *)(pdVar4 + iVar11 * 8)) {
            uVar10 = uVar5;
          }
          lVar12 = *(long *)(pdVar2 + iVar11 * 8);
          lVar8 = NumericCastImpl<long,_unsigned_long,_false>::Convert(uVar5 - lVar12);
          lVar12 = uVar10 - lVar12;
          auVar15._8_4_ = (int)((ulong)lVar12 >> 0x20);
          auVar15._0_8_ = lVar12;
          auVar15._12_4_ = 0x45300000;
          if (lVar8 < 1) {
            dVar16 = 0.0;
          }
          else {
            dVar16 = ((auVar15._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)lVar12) - 4503599627370496.0)) /
                     (double)lVar8;
          }
          *(double *)(pdVar1 + iVar11 * 8) = dVar16;
          iVar11 = iVar11 + 1;
        } while (count != iVar11);
      }
    }
    else if (count != 0) {
      iVar11 = 0;
      do {
        this_00 = unique_ptr<duckdb::WindowTokenTree,_std::default_delete<duckdb::WindowTokenTree>,_true>
                  ::operator->((unique_ptr<duckdb::WindowTokenTree,_std::default_delete<duckdb::WindowTokenTree>,_true>
                                *)&gstate[1].executor);
        iVar7 = WindowTokenTree::PeerEnd
                          (this_00,*(idx_t *)(pdVar2 + iVar11 * 8),*(idx_t *)(pdVar3 + iVar11 * 8),
                           row_idx + iVar11);
        lVar12 = *(long *)(pdVar2 + iVar11 * 8);
        lVar8 = NumericCastImpl<long,_unsigned_long,_false>::Convert
                          (*(long *)(pdVar3 + iVar11 * 8) - lVar12);
        lVar12 = iVar7 - lVar12;
        auVar13._8_4_ = (int)((ulong)lVar12 >> 0x20);
        auVar13._0_8_ = lVar12;
        auVar13._12_4_ = 0x45300000;
        if (lVar8 < 1) {
          dVar16 = 0.0;
        }
        else {
          dVar16 = ((auVar13._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)lVar12) - 4503599627370496.0)) / (double)lVar8;
        }
        *(double *)(pdVar1 + iVar11 * 8) = dVar16;
        iVar11 = iVar11 + 1;
      } while (count != iVar11);
    }
  }
  else {
    pvVar6 = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)this_01,0);
    pdVar2 = pvVar6->data;
    pvVar6 = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)this_01,1);
    pdVar3 = pvVar6->data;
    pvVar6 = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)this_01,3);
    if (count != 0) {
      pdVar4 = pvVar6->data;
      iVar11 = 0;
      do {
        lVar12 = *(long *)(pdVar2 + iVar11 * 8);
        lVar8 = *(long *)(pdVar4 + iVar11 * 8);
        lVar9 = NumericCastImpl<long,_unsigned_long,_false>::Convert
                          (*(long *)(pdVar3 + iVar11 * 8) - lVar12);
        lVar8 = lVar8 - lVar12;
        auVar14._8_4_ = (int)((ulong)lVar8 >> 0x20);
        auVar14._0_8_ = lVar8;
        auVar14._12_4_ = 0x45300000;
        if (lVar9 < 1) {
          dVar16 = 0.0;
        }
        else {
          dVar16 = ((auVar14._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)lVar8) - 4503599627370496.0)) / (double)lVar9;
        }
        *(double *)(pdVar1 + iVar11 * 8) = dVar16;
        iVar11 = iVar11 + 1;
      } while (count != iVar11);
    }
  }
  return;
}

Assistant:

void WindowCumeDistExecutor::EvaluateInternal(WindowExecutorGlobalState &gstate, WindowExecutorLocalState &lstate,
                                              DataChunk &eval_chunk, Vector &result, idx_t count, idx_t row_idx) const {
	auto &gpeer = gstate.Cast<WindowPeerGlobalState>();
	auto &lpeer = lstate.Cast<WindowPeerLocalState>();
	auto rdata = FlatVector::GetData<double>(result);

	if (gpeer.use_framing) {
		auto frame_begin = FlatVector::GetData<const idx_t>(lpeer.bounds.data[FRAME_BEGIN]);
		auto frame_end = FlatVector::GetData<const idx_t>(lpeer.bounds.data[FRAME_END]);
		if (gpeer.token_tree) {
			for (idx_t i = 0; i < count; ++i, ++row_idx) {
				const auto peer_end = gpeer.token_tree->PeerEnd(frame_begin[i], frame_end[i], row_idx);
				rdata[i] = CumeDist(frame_begin[i], frame_end[i], peer_end);
			}
		} else {
			auto peer_end = FlatVector::GetData<const idx_t>(lpeer.bounds.data[PEER_END]);
			for (idx_t i = 0; i < count; ++i, ++row_idx) {
				//	Clamp the peer end to the frame
				const auto frame_peer_end = MinValue(peer_end[i], frame_end[i]);
				rdata[i] = CumeDist(frame_begin[i], frame_end[i], frame_peer_end);
			}
		}
		return;
	}

	auto partition_begin = FlatVector::GetData<const idx_t>(lpeer.bounds.data[PARTITION_BEGIN]);
	auto partition_end = FlatVector::GetData<const idx_t>(lpeer.bounds.data[PARTITION_END]);
	auto peer_end = FlatVector::GetData<const idx_t>(lpeer.bounds.data[PEER_END]);
	for (idx_t i = 0; i < count; ++i, ++row_idx) {
		rdata[i] = CumeDist(partition_begin[i], partition_end[i], peer_end[i]);
	}
}